

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECI.cpp
# Opt level: O0

string * ZXing::ToString_abi_cxx11_(ECI eci)

{
  ECI in_ESI;
  string *in_RDI;
  int in_stack_00000068;
  int in_stack_0000006c;
  string *__rhs;
  char __lhs;
  string local_30 [48];
  
  __rhs = in_RDI;
  ToInt(in_ESI);
  __lhs = (char)((ulong)local_30 >> 0x38);
  ToString<int,void>(in_stack_0000006c,in_stack_00000068);
  std::operator+(__lhs,__rhs);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string ToString(ECI eci)
{
	return '\\' + ToString(ToInt(eci), 6);
}